

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.h
# Opt level: O1

void * alias_table_internal_table_get_cell(alias_table_internal_table *table,void *key)

{
  alias_table_internal_table_cell_struct *paVar1;
  uint uVar2;
  alias_table_internal_table_cell_struct *paVar3;
  ulong uVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  alias_table_internal_table_cell_struct *paVar9;
  uint uVar10;
  uint uVar11;
  bool bVar12;
  bool bVar13;
  
  do {
    cVar5 = *key;
    uVar11 = 0;
    if (cVar5 != '\0') {
      uVar11 = 0;
      pcVar8 = (char *)((long)key + 1);
      do {
        uVar11 = uVar11 * 0x1003f + (int)cVar5;
        cVar5 = *pcVar8;
        pcVar8 = pcVar8 + 1;
      } while (cVar5 != '\0');
    }
    uVar2 = table->table_size;
    uVar4 = (ulong)uVar11 % (ulong)uVar2;
    paVar3 = table->table;
    pcVar8 = paVar3[uVar4].value.name;
    if (pcVar8 != (char *)0x0) {
      bVar12 = pcVar8 == (char *)key;
      if (pcVar8 != (char *)0x0 && !bVar12) {
        iVar6 = strcmp((char *)key,pcVar8);
        bVar12 = iVar6 == 0;
      }
      paVar1 = paVar3 + uVar4;
      if (bVar12) {
        return paVar1;
      }
      uVar10 = paVar1->secondMaps;
      bVar12 = uVar10 == 0;
      paVar9 = paVar1;
      if (!bVar12) {
        iVar6 = 0;
        if (uVar10 != 0) {
          for (; (uVar10 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
          }
        }
        do {
          bVar13 = false;
          uVar4 = (ulong)(uVar11 + iVar6 + 1) % (ulong)uVar2;
          pcVar8 = paVar3[uVar4].value.name;
          if (pcVar8 != (char *)key) {
            if (pcVar8 == (char *)0x0) {
              bVar13 = true;
            }
            else {
              iVar7 = strcmp((char *)key,pcVar8);
              bVar13 = iVar7 != 0;
            }
          }
          paVar9 = paVar3 + uVar4;
          if (!bVar13) break;
          uVar10 = uVar10 & ~(1 << ((byte)((char)(iVar6 + 1) - 1) & 0x1f));
          iVar6 = 0;
          if (uVar10 != 0) {
            for (; (uVar10 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
            }
          }
          if (uVar10 == 0) {
            iVar6 = -1;
          }
          bVar12 = uVar10 == 0;
          paVar9 = paVar1;
        } while (!bVar12);
      }
      if (!bVar12) {
        return paVar9;
      }
    }
    table = table->old;
    if (table == (alias_table_internal_table_struct *)0x0) {
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

static void *PREFIX(_table_get_cell)(PREFIX(_table) *table, const void *key)
{
	uint32_t hash = MAP_TABLE_HASH_KEY(key);
	PREFIX(_table_cell) cell = PREFIX(_table_lookup)(table, hash);
	// Value does not exist.
	if (!MAP_TABLE_VALUE_NULL(cell->value))
	{
		if (MAP_TABLE_COMPARE_FUNCTION(key, cell->value))
		{
			return cell;
		}
		uint32_t jump = cell->secondMaps;
		// Look at each offset defined by the jump table to find the displaced location.
		for (int hop = __builtin_ffs(jump) ; hop > 0 ; hop = __builtin_ffs(jump))
		{
			PREFIX(_table_cell) hopCell = PREFIX(_table_lookup)(table, hash+hop);
			if (MAP_TABLE_COMPARE_FUNCTION(key, hopCell->value))
			{
				return hopCell;
			}
			// Clear the most significant bit and try again.
			jump &= ~(1 << (hop-1));
		}
	}
#ifndef MAP_TABLE_STATIC_SIZE
	if (table->old)
	{
		return PREFIX(_table_get_cell)(table->old, key);
	}
#endif
	return NULL;
}